

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int stb_vorbis_get_samples_short_interleaved
              (stb_vorbis *f,int channels,short *buffer,int num_shorts)

{
  int iVar1;
  int iVar2;
  int len;
  int iVar3;
  int iVar4;
  float **outputs;
  float **local_38;
  
  iVar3 = num_shorts / channels;
  iVar4 = 0;
  while( true ) {
    if (iVar3 - iVar4 == 0 || iVar3 < iVar4) {
      return iVar4;
    }
    iVar2 = f->channel_buffer_start;
    iVar1 = f->channel_buffer_end - iVar2;
    len = iVar3 - iVar4;
    if (iVar1 + iVar4 < iVar3) {
      len = iVar1;
    }
    if (len != 0) {
      convert_channels_short_interleaved(channels,buffer,f->channels,f->channel_buffers,iVar2,len);
      iVar2 = f->channel_buffer_start;
    }
    iVar4 = iVar4 + len;
    f->channel_buffer_start = iVar2 + len;
    if (iVar4 == iVar3) break;
    buffer = buffer + len * channels;
    iVar2 = stb_vorbis_get_frame_float(f,(int *)0x0,&local_38);
    if (iVar2 == 0) {
      return iVar4;
    }
  }
  return iVar3;
}

Assistant:

int stb_vorbis_get_samples_short_interleaved(stb_vorbis *f, int channels, short *buffer, int num_shorts)
{
   float **outputs;
   int len = num_shorts / channels;
   int n=0;
   while (n < len) {
      int k = f->channel_buffer_end - f->channel_buffer_start;
      if (n+k >= len) k = len - n;
      if (k)
         convert_channels_short_interleaved(channels, buffer, f->channels, f->channel_buffers, f->channel_buffer_start, k);
      buffer += k*channels;
      n += k;
      f->channel_buffer_start += k;
      if (n == len) break;
      if (!stb_vorbis_get_frame_float(f, NULL, &outputs)) break;
   }
   return n;
}